

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::InstanceSymbol::InstanceSymbol
          (InstanceSymbol *this,Compilation *compilation,string_view name,SourceLocation loc,
          Definition *definition,ParameterBuilder *paramBuilder,bool isUninstantiated)

{
  InstanceBodySymbol *pIVar1;
  
  pIVar1 = InstanceBodySymbol::fromDefinition
                     (compilation,definition,loc,paramBuilder,isUninstantiated);
  (this->super_InstanceSymbolBase).super_Symbol.kind = Instance;
  (this->super_InstanceSymbolBase).super_Symbol.name._M_len = name._M_len;
  (this->super_InstanceSymbolBase).super_Symbol.name._M_str = name._M_str;
  (this->super_InstanceSymbolBase).super_Symbol.location = loc;
  (this->super_InstanceSymbolBase).super_Symbol.parentScope = (Scope *)0x0;
  (this->super_InstanceSymbolBase).super_Symbol.nextInScope = (Symbol *)0x0;
  (this->super_InstanceSymbolBase).super_Symbol.indexInScope = 0;
  (this->super_InstanceSymbolBase).super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (this->super_InstanceSymbolBase).arrayPath.data_ = (pointer)0x0;
  (this->super_InstanceSymbolBase).arrayPath.size_ = 0;
  this->body = pIVar1;
  this->connections = (PointerMap *)0x0;
  pIVar1->parentInstance = this;
  return;
}

Assistant:

InstanceSymbol::InstanceSymbol(Compilation& compilation, string_view name, SourceLocation loc,
                               const Definition& definition, ParameterBuilder& paramBuilder,
                               bool isUninstantiated) :
    InstanceSymbol(name, loc,
                   InstanceBodySymbol::fromDefinition(compilation, definition, loc, paramBuilder,
                                                      isUninstantiated)) {
}